

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O1

SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *
Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::New
          (HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *bucket)

{
  undefined4 *puVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  HeapAllocator *pHVar5;
  size_t sVar6;
  char *__s;
  size_t byteSize;
  uint objectCount;
  undefined8 *in_FS_OFFSET;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (0x300 < (bucket->super_HeapBucket).sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x3e,"(bucket->sizeCat <= TBlockAttributes::MaxObjectSize)",
                       "bucket->sizeCat <= TBlockAttributes::MaxObjectSize");
    if (!bVar4) goto LAB_0028d808;
    *puVar1 = 0;
  }
  data._36_4_ = ZEXT24((ushort)(bucket->super_HeapBucket).sizeCat);
  uVar2 = (ulong)(uint)data._36_4_;
  pHVar5 = HeapAllocator::GetNoMemProtectInstance();
  objectCount = (uint)(0x1000 / uVar2);
  data.typeinfo =
       (type_info *)SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAllocPlusSize(objectCount);
  local_60 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_186411;
  data.filename._0_4_ = 0x43;
  pHVar5 = HeapAllocator::TrackAllocInfo(pHVar5,(TrackAllocData *)local_60);
  sVar6 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAllocPlusSize(objectCount);
  if (sVar6 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x240,"(plusSize != 0)","plusSize != 0");
    if (!bVar4) goto LAB_0028d808;
    *puVar1 = 0;
  }
  if ((sVar6 + 7 & 0xfffffffffffffff8) != sVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x243,"(plusSize == Math::Align<size_t>(plusSize, sizeof(size_t)))",
                       "plusSize == Math::Align<size_t>(plusSize, sizeof(size_t))");
    if (!bVar4) {
LAB_0028d808:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  byteSize = 0xffffffffffffffff;
  if (sVar6 < 0xfffffffffffffed8) {
    byteSize = sVar6 + 0x128;
  }
  __s = HeapAllocator::AllocT<true>(pHVar5,byteSize);
  if (__s == (char *)0x0) {
    sVar6 = 0;
  }
  else {
    memset(__s,0,byteSize);
  }
  SmallFinalizableHeapBlockT
            ((SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)(__s + sVar6),bucket,
             data._36_2_,(ushort)(0x1000 / uVar2));
  return (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)(__s + sVar6);
}

Assistant:

SmallFinalizableHeapBlockT<TBlockAttributes> *
SmallFinalizableHeapBlockT<TBlockAttributes>::New(HeapBucketT<SmallFinalizableHeapBlockT<TBlockAttributes>> * bucket)
{
    CompileAssert(TBlockAttributes::MaxObjectSize <= USHRT_MAX);
    Assert(bucket->sizeCat <= TBlockAttributes::MaxObjectSize);
    Assert((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucket->sizeCat <= USHRT_MAX);

    ushort objectSize = (ushort)bucket->sizeCat;
    ushort objectCount = (ushort)((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / objectSize);
    return NoMemProtectHeapNewNoThrowPlusPrefixZ(Base::GetAllocPlusSize(objectCount), SmallFinalizableHeapBlockT<TBlockAttributes>, bucket, objectSize, objectCount);
}